

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O3

bool P_LookForTID(AActor *actor,INTBOOL allaround,FLookExParams *params)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  AActor *pAVar4;
  AActor *pAVar5;
  AActor **ppAVar6;
  AActor *pAVar7;
  byte bVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  AActor *pAVar12;
  
  if (params == (FLookExParams *)0x0) {
    bVar8 = 0;
  }
  else {
    bVar8 = ((byte)params->flags & 4) >> 2;
  }
  pAVar4 = P_BlockmapSearch(actor,0,LookForTIDInBlock,params);
  if (pAVar4 != (AActor *)0x0) {
    pAVar5 = (actor->goal).field_0.p;
    if (pAVar5 != (AActor *)0x0) {
      if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        pAVar12 = (actor->target).field_0.p;
        pAVar7 = (AActor *)0x0;
        if ((pAVar12 != (AActor *)0x0) &&
           (((pAVar12->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0)) {
          pAVar7 = pAVar12;
        }
        if (pAVar7 == pAVar5) {
          actor->reactiontime = 0;
        }
      }
      else {
        (actor->goal).field_0.p = (AActor *)0x0;
      }
    }
    (actor->target).field_0.p = pAVar4;
    (actor->LastLookActor).field_0.p = pAVar4;
    return true;
  }
  pAVar4 = (actor->LastLookActor).field_0.p;
  if (pAVar4 != (AActor *)0x0) {
    if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      uVar3 = actor->TIDtoHate;
      uVar11 = pAVar4->tid;
      if (pAVar4->tid != uVar3) {
        (actor->LastLookActor).field_0.p = (AActor *)0x0;
        pAVar4 = (AActor *)0x0;
        uVar11 = uVar3;
      }
      goto LAB_003f0ad0;
    }
    (actor->LastLookActor).field_0.p = (AActor *)0x0;
  }
  uVar11 = actor->TIDtoHate;
  pAVar4 = (AActor *)0x0;
LAB_003f0ad0:
  uVar3 = FRandom::GenRand32(&pr_look3);
  iVar10 = (uVar3 & 0x1f) + 7;
  bVar2 = false;
LAB_003f0b01:
  do {
    bVar9 = bVar2;
    pAVar5 = (actor->LastLookActor).field_0.p;
    do {
      if (uVar11 != 0) {
        ppAVar6 = &pAVar4->inext;
        if (pAVar4 == (AActor *)0x0) {
          ppAVar6 = (AActor **)((long)AActor::TIDHash + (ulong)((uVar11 & 0x7f) << 3));
        }
        for (pAVar4 = *ppAVar6; pAVar4 != (AActor *)0x0; pAVar4 = pAVar4->inext) {
          pAVar12 = pAVar4;
          if (pAVar4->tid == uVar11) goto LAB_003f0b3e;
        }
        pAVar4 = (AActor *)0x0;
      }
      pAVar12 = (AActor *)0x0;
LAB_003f0b3e:
      if (pAVar5 == (AActor *)0x0) {
LAB_003f0b54:
        pAVar5 = (AActor *)0x0;
      }
      else if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
        (actor->LastLookActor).field_0.p = (AActor *)0x0;
        goto LAB_003f0b54;
      }
      if (pAVar12 == pAVar5) goto LAB_003f0c32;
      if (pAVar12 == (AActor *)0x0) {
        bVar2 = true;
        if (bVar9) goto LAB_003f0c32;
        goto LAB_003f0b01;
      }
    } while ((((pAVar12 == actor) || (((pAVar12->flags).Value & 4) == 0)) || (pAVar12->health < 1))
            || (((pAVar12->flags2).Value & 0x10000000) != 0));
    iVar10 = iVar10 + -1;
    if (iVar10 == 0) {
LAB_003f0c32:
      (actor->LastLookActor).field_0.p = pAVar12;
      pAVar4 = (actor->target).field_0.p;
      if (pAVar4 != (AActor *)0x0) {
        if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          return false;
        }
        (actor->target).field_0.p = (AActor *)0x0;
      }
      pAVar4 = (actor->goal).field_0.p;
      if (pAVar4 != (AActor *)0x0) {
        if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          if (bVar8 == 0) {
            (actor->target).field_0.p = pAVar4;
            return true;
          }
        }
        else {
          (actor->goal).field_0.p = (AActor *)0x0;
        }
      }
      pAVar4 = (actor->lastenemy).field_0.p;
      if (pAVar4 != (AActor *)0x0) {
        if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          if (pAVar4->health < 1) {
            return false;
          }
          bVar2 = AActor::IsFriend(actor,pAVar4);
          if (!bVar2) {
            (actor->target).field_0 = (actor->lastenemy).field_0;
            (actor->lastenemy).field_0.p = (AActor *)0x0;
            return true;
          }
        }
        (actor->lastenemy).field_0.p = (AActor *)0x0;
      }
      return false;
    }
    if ((((actor->flags3).Value & 0x80) != 0) ||
       (bVar1 = P_IsVisible(actor,pAVar12,(uint)(allaround != 0),params), bVar2 = bVar9, bVar1)) {
      pAVar4 = (actor->goal).field_0.p;
      if (pAVar4 != (AActor *)0x0) {
        if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          pAVar5 = (actor->target).field_0.p;
          pAVar7 = (AActor *)0x0;
          if ((pAVar5 != (AActor *)0x0) &&
             (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0)) {
            pAVar7 = pAVar5;
          }
          if (pAVar7 == pAVar4) {
            actor->reactiontime = 0;
          }
        }
        else {
          (actor->goal).field_0.p = (AActor *)0x0;
        }
      }
      (actor->target).field_0.p = pAVar12;
      (actor->LastLookActor).field_0.p = pAVar12;
      return true;
    }
  } while( true );
}

Assistant:

bool P_LookForTID (AActor *actor, INTBOOL allaround, FLookExParams *params)
{
	AActor *other;
	bool reachedend = false;
	bool chasegoal = params? (!(params->flags & LOF_DONTCHASEGOAL)) : true;

	other = P_BlockmapSearch (actor, 0, LookForTIDInBlock, params);

	if (other != NULL)
	{
		if (actor->goal && actor->target == actor->goal)
			actor->reactiontime = 0;

		actor->target = other;
		actor->LastLookActor = other;
		return true;
	}

	// The actor's TID could change because of death or because of
	// Thing_ChangeTID. If it's not what we expect, then don't use
	// it as a base for the iterator.
	if (actor->LastLookActor != NULL &&
		actor->LastLookActor->tid != actor->TIDtoHate)
	{
		actor->LastLookActor = NULL;
	}

	FActorIterator iterator (actor->TIDtoHate, actor->LastLookActor);
	int c = (pr_look3() & 31) + 7;	// Look for between 7 and 38 hatees at a time
	while ((other = iterator.Next()) != actor->LastLookActor)
	{
		if (other == NULL)
		{
			if (reachedend)
			{
				// we have cycled through the entire list at least once
				// so let's abort because even if we continue nothing can
				// be found.
				break;
			}
			reachedend = true;
			continue;
		}

		if (!(other->flags & MF_SHOOTABLE))
			continue;			// not shootable (observer or dead)

		if (other == actor)
			continue;			// don't hate self

		if (other->health <= 0)
			continue;			// dead

		if (other->flags2 & MF2_DORMANT)
			continue;			// don't target dormant things

		if (--c == 0)
			break;

		if (!(actor->flags3 & MF3_NOSIGHTCHECK))
		{
			if (!P_IsVisible (actor, other, !!allaround, params))
				continue;			// out of sight
		}
		
		// [RH] Need to be sure the reactiontime is 0 if the monster is
		//		leaving its goal to go after something else.
		if (actor->goal && actor->target == actor->goal)
			actor->reactiontime = 0;

		actor->target = other;
		actor->LastLookActor = other;
		return true;
	}
	actor->LastLookActor = other;
	if (actor->target == NULL)
	{
		// [RH] use goal as target
		if (actor->goal != NULL && chasegoal)
		{
			actor->target = actor->goal;
			return true;
		}
		// Use last known enemy if no hatee sighted -- killough 2/15/98:
		if (actor->lastenemy != NULL && actor->lastenemy->health > 0)
		{
			if (!actor->IsFriend(actor->lastenemy))
			{
				actor->target = actor->lastenemy;
				actor->lastenemy = NULL;
				return true;
			}
			else
			{
				actor->lastenemy = NULL;
			}
		}
	}
	return false;
}